

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

void * GENERAL_NAME_get0_value(GENERAL_NAME *a,int *ptype)

{
  int *out_type_local;
  GENERAL_NAME *a_local;
  
  if (ptype != (int *)0x0) {
    *ptype = a->type;
  }
  switch(a->type) {
  case 0:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  case 1:
  case 2:
  case 6:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  case 3:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  case 4:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  case 5:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  case 7:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  case 8:
    a_local = (GENERAL_NAME *)(a->d).otherName;
    break;
  default:
    a_local = (GENERAL_NAME *)0x0;
  }
  return a_local;
}

Assistant:

void *GENERAL_NAME_get0_value(const GENERAL_NAME *a, int *out_type) {
  if (out_type) {
    *out_type = a->type;
  }
  switch (a->type) {
    case GEN_X400:
      return a->d.x400Address;

    case GEN_EDIPARTY:
      return a->d.ediPartyName;

    case GEN_OTHERNAME:
      return a->d.otherName;

    case GEN_EMAIL:
    case GEN_DNS:
    case GEN_URI:
      return a->d.ia5;

    case GEN_DIRNAME:
      return a->d.dirn;

    case GEN_IPADD:
      return a->d.ip;

    case GEN_RID:
      return a->d.rid;

    default:
      return NULL;
  }
}